

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_9.c
# Opt level: O1

int * aom_fast9_score(byte *i,int stride,xy *corners,int num_corners,int b)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  
  piVar9 = (int *)malloc((long)num_corners << 2);
  if (piVar9 == (int *)0x0) {
    piVar9 = (int *)0x0;
  }
  else if (0 < num_corners) {
    lVar20 = (long)stride;
    lVar6 = lVar20 * 3;
    lVar7 = lVar20 * 2;
    lVar1 = (long)(stride * -2) + 2;
    lVar24 = lVar20 * -3;
    lVar2 = (long)(int)lVar24 + 1;
    lVar25 = (long)(int)lVar24 + -1;
    lVar13 = (long)(stride * -2) + -2;
    lVar3 = lVar20 + -3;
    lVar21 = (long)(int)lVar7 + -2;
    lVar22 = (long)(int)lVar6 + -1;
    lVar14 = (long)(-3 - stride);
    lVar15 = (long)(3 - stride);
    uVar23 = 0;
LAB_00bda895:
    lVar10 = corners[uVar23].y * lVar20;
    lVar8 = corners[uVar23].x + lVar10;
    iVar19 = 0xff;
    iVar18 = (b - (b + 0xff >> 0x1f)) + 0xff >> 1;
    iVar28 = b;
    do {
      iVar4 = iVar18 + (uint)i[corners[uVar23].x + lVar10];
      iVar11 = (uint)i[corners[uVar23].x + lVar10] - iVar18;
      lVar16 = lVar21;
      lVar17 = lVar13;
      lVar27 = lVar3;
      if (iVar4 < (int)(uint)i[lVar6 + lVar8]) {
        lVar26 = lVar14;
        if (iVar4 < (int)(uint)i[lVar6 + lVar8 + 1]) {
          if (iVar4 < (int)(uint)i[lVar7 + lVar8 + 2]) {
            if (iVar4 < (int)(uint)i[lVar20 + lVar8 + 3]) {
              if (iVar4 < (int)(uint)i[lVar8 + 3]) {
                if (iVar4 < (int)(uint)i[lVar15 + lVar8]) {
                  if (iVar4 < (int)(uint)i[lVar1 + lVar8]) {
                    if (iVar4 < (int)(uint)i[lVar2 + lVar8]) {
                      bVar5 = i[lVar24 + lVar8];
                      lVar17 = lVar22;
                      goto joined_r0x00bdafb5;
                    }
                    if ((int)(uint)i[lVar2 + lVar8] < iVar11) {
                      lVar17 = lVar22;
                      if (iVar4 < (int)(uint)i[lVar21 + lVar8]) goto LAB_00bdbe58;
                      if ((((int)(uint)i[lVar21 + lVar8] < iVar11) &&
                          ((int)(uint)i[lVar24 + lVar8] < iVar11)) &&
                         (((int)(uint)i[lVar25 + lVar8] < iVar11 &&
                          (((int)(uint)i[lVar13 + lVar8] < iVar11 &&
                           ((int)(uint)i[lVar14 + lVar8] < iVar11)))))) {
                        bVar5 = i[lVar8 + -3];
                        lVar16 = lVar3;
                        goto joined_r0x00bdbaf7;
                      }
                    }
                    else {
LAB_00bdbe45:
                      bVar5 = i[lVar16 + lVar8];
                      lVar17 = lVar22;
joined_r0x00bdbb47:
                      if (iVar4 < (int)(uint)bVar5) goto LAB_00bdbe58;
                    }
                  }
                  else if ((int)(uint)i[lVar1 + lVar8] < iVar11) {
                    if (iVar4 < (int)(uint)i[lVar22 + lVar8]) {
                      lVar17 = lVar21;
                      if (iVar4 < (int)(uint)i[lVar3 + lVar8]) goto LAB_00bdbe58;
                      if (((((int)(uint)i[lVar3 + lVar8] < iVar11) &&
                           ((int)(uint)i[lVar2 + lVar8] < iVar11)) &&
                          ((int)(uint)i[lVar24 + lVar8] < iVar11)) &&
                         ((((int)(uint)i[lVar25 + lVar8] < iVar11 &&
                           ((int)(uint)i[lVar13 + lVar8] < iVar11)) &&
                          ((int)(uint)i[lVar14 + lVar8] < iVar11)))) {
                        bVar5 = i[lVar8 + -3];
                        lVar27 = lVar21;
                        goto joined_r0x00bdc063;
                      }
                    }
                    else if ((((int)(uint)i[lVar2 + lVar8] < iVar11) &&
                             ((int)(uint)i[lVar24 + lVar8] < iVar11)) &&
                            ((int)(uint)i[lVar25 + lVar8] < iVar11)) goto LAB_00bdc22b;
                  }
                  else {
                    if (iVar4 < (int)(uint)i[lVar3 + lVar8]) goto LAB_00bdbe45;
                    if (((((int)(uint)i[lVar3 + lVar8] < iVar11) &&
                         ((int)(uint)i[lVar2 + lVar8] < iVar11)) &&
                        ((int)(uint)i[lVar24 + lVar8] < iVar11)) &&
                       ((((int)(uint)i[lVar25 + lVar8] < iVar11 &&
                         ((int)(uint)i[lVar13 + lVar8] < iVar11)) &&
                        ((int)(uint)i[lVar14 + lVar8] < iVar11)))) {
                      bVar5 = i[lVar8 + -3];
                      goto joined_r0x00bdbaf7;
                    }
                  }
                }
                else if ((int)(uint)i[lVar15 + lVar8] < iVar11) {
                  if (iVar4 < (int)(uint)i[lVar21 + lVar8]) {
                    lVar17 = lVar3;
                    if (iVar4 < (int)(uint)i[lVar8 + -3]) {
LAB_00bdb943:
                      if (iVar4 < (int)(uint)i[lVar17 + lVar8]) {
                        if (iVar4 < (int)(uint)i[lVar22 + lVar8]) goto LAB_00bdcff8;
                        if (((iVar4 < (int)(uint)i[lVar1 + lVar8]) &&
                            (iVar4 < (int)(uint)i[lVar2 + lVar8])) &&
                           ((iVar4 < (int)(uint)i[lVar24 + lVar8] &&
                            (iVar4 < (int)(uint)i[lVar25 + lVar8])))) goto LAB_00bdaa02;
                      }
                    }
                    else if ((((((int)(uint)i[lVar8 + -3] < iVar11) &&
                               ((int)(uint)i[lVar1 + lVar8] < iVar11)) &&
                              ((int)(uint)i[lVar2 + lVar8] < iVar11)) &&
                             (((int)(uint)i[lVar24 + lVar8] < iVar11 &&
                              ((int)(uint)i[lVar25 + lVar8] < iVar11)))) &&
                            ((int)(uint)i[lVar13 + lVar8] < iVar11)) {
                      bVar5 = i[lVar14 + lVar8];
                      goto joined_r0x00bdc063;
                    }
                  }
                  else if ((int)(uint)i[lVar21 + lVar8] < iVar11) {
                    if ((((int)(uint)i[lVar2 + lVar8] < iVar11) &&
                        ((int)(uint)i[lVar24 + lVar8] < iVar11)) &&
                       (((int)(uint)i[lVar25 + lVar8] < iVar11 &&
                        (((int)(uint)i[lVar13 + lVar8] < iVar11 &&
                         ((int)(uint)i[lVar14 + lVar8] < iVar11)))))) {
                      bVar5 = i[lVar8 + -3];
                      lVar17 = lVar3;
                      goto joined_r0x00bdbfe3;
                    }
                  }
                  else if (((((int)(uint)i[lVar1 + lVar8] < iVar11) &&
                            ((int)(uint)i[lVar2 + lVar8] < iVar11)) &&
                           ((int)(uint)i[lVar24 + lVar8] < iVar11)) &&
                          ((int)(uint)i[lVar25 + lVar8] < iVar11)) goto LAB_00bdc35d;
                }
                else if (iVar4 < (int)(uint)i[lVar8 + -3]) {
                  lVar17 = lVar21;
                  if (iVar4 < (int)(uint)i[lVar3 + lVar8]) goto LAB_00bdb943;
                }
                else if (((((int)(uint)i[lVar8 + -3] < iVar11) &&
                          ((int)(uint)i[lVar2 + lVar8] < iVar11)) &&
                         (((int)(uint)i[lVar24 + lVar8] < iVar11 &&
                          (((int)(uint)i[lVar25 + lVar8] < iVar11 &&
                           ((int)(uint)i[lVar13 + lVar8] < iVar11)))))) &&
                        ((int)(uint)i[lVar14 + lVar8] < iVar11)) {
                  bVar5 = i[lVar3 + lVar8];
                  lVar17 = lVar21;
joined_r0x00bdbfe3:
                  if (((int)(uint)bVar5 < iVar11) && ((int)(uint)i[lVar17 + lVar8] < iVar11)) {
                    bVar5 = i[lVar1 + lVar8];
                    lVar27 = lVar22;
                    goto joined_r0x00bdb9f1;
                  }
                }
              }
              else if ((int)(uint)i[lVar8 + 3] < iVar11) {
                if (iVar4 < (int)(uint)i[lVar3 + lVar8]) {
                  if (iVar4 < (int)(uint)i[lVar14 + lVar8]) {
                    bVar5 = i[lVar8 + -3];
LAB_00bdb4f7:
                    if (iVar4 < (int)(uint)bVar5) {
                      if (iVar4 < (int)(uint)i[lVar21 + lVar8]) {
                        if (iVar4 < (int)(uint)i[lVar22 + lVar8]) goto LAB_00bdcff8;
                      }
                      else if ((int)(uint)i[lVar15 + lVar8] <= iVar4) goto LAB_00bdcff3;
                      if (((iVar4 < (int)(uint)i[lVar1 + lVar8]) &&
                          (iVar4 < (int)(uint)i[lVar2 + lVar8])) &&
                         (iVar4 < (int)(uint)i[lVar24 + lVar8])) {
                        bVar5 = i[lVar25 + lVar8];
                        goto joined_r0x00bdbb47;
                      }
                    }
                  }
                  else if ((((int)(uint)i[lVar14 + lVar8] < iVar11) &&
                           ((int)(uint)i[lVar15 + lVar8] < iVar11)) &&
                          (((int)(uint)i[lVar1 + lVar8] < iVar11 &&
                           (((int)(uint)i[lVar2 + lVar8] < iVar11 &&
                            ((int)(uint)i[lVar24 + lVar8] < iVar11)))))) {
                    bVar5 = i[lVar25 + lVar8];
                    lVar26 = lVar13;
joined_r0x00bdbeca:
                    if ((int)(uint)bVar5 < iVar11) goto LAB_00bdbed5;
                  }
                }
                else if ((int)(uint)i[lVar3 + lVar8] < iVar11) {
                  if (((((int)(uint)i[lVar2 + lVar8] < iVar11) &&
                       ((int)(uint)i[lVar24 + lVar8] < iVar11)) &&
                      ((int)(uint)i[lVar25 + lVar8] < iVar11)) &&
                     (((int)(uint)i[lVar13 + lVar8] < iVar11 &&
                      ((int)(uint)i[lVar14 + lVar8] < iVar11)))) {
                    bVar5 = i[lVar8 + -3];
                    goto LAB_00bdb9ca;
                  }
                }
                else if ((((int)(uint)i[lVar15 + lVar8] < iVar11) &&
                         ((int)(uint)i[lVar1 + lVar8] < iVar11)) &&
                        (((int)(uint)i[lVar2 + lVar8] < iVar11 &&
                         (((int)(uint)i[lVar24 + lVar8] < iVar11 &&
                          ((int)(uint)i[lVar25 + lVar8] < iVar11)))))) {
LAB_00bdbebd:
                  bVar5 = i[lVar13 + lVar8];
                  goto joined_r0x00bdbeca;
                }
              }
              else if (iVar4 < (int)(uint)i[lVar14 + lVar8]) {
                if (iVar4 < (int)(uint)i[lVar8 + -3]) {
                  bVar5 = i[lVar3 + lVar8];
                  goto LAB_00bdb4f7;
                }
              }
              else if (((((int)(uint)i[lVar14 + lVar8] < iVar11) &&
                        ((int)(uint)i[lVar2 + lVar8] < iVar11)) &&
                       ((int)(uint)i[lVar24 + lVar8] < iVar11)) &&
                      ((((int)(uint)i[lVar25 + lVar8] < iVar11 &&
                        ((int)(uint)i[lVar13 + lVar8] < iVar11)) &&
                       ((int)(uint)i[lVar8 + -3] < iVar11)))) {
                bVar5 = i[lVar3 + lVar8];
LAB_00bdb9ca:
                if ((int)(uint)bVar5 < iVar11) {
                  if (iVar11 <= (int)(uint)i[lVar1 + lVar8]) goto LAB_00bdbc7d;
                  bVar5 = i[lVar15 + lVar8];
                  lVar27 = lVar21;
                  goto joined_r0x00bdb9f1;
                }
              }
            }
            else if ((int)(uint)i[lVar20 + lVar8 + 3] < iVar11) {
              if (iVar4 < (int)(uint)i[lVar13 + lVar8]) {
                if ((iVar4 < (int)(uint)i[lVar14 + lVar8]) && (iVar4 < (int)(uint)i[lVar8 + -3])) {
                  if ((int)(uint)i[lVar3 + lVar8] <= iVar4) {
                    bVar5 = i[lVar8 + 3];
                    goto joined_r0x00bdc0ad;
                  }
LAB_00bdb1f9:
                  if (iVar4 < (int)(uint)i[lVar21 + lVar8]) {
                    if (iVar4 < (int)(uint)i[lVar22 + lVar8]) goto LAB_00bdcff8;
                  }
                  else {
LAB_00bdc0b3:
                    if ((int)(uint)i[lVar15 + lVar8] <= iVar4) goto LAB_00bdcff3;
                  }
                  if (((iVar4 < (int)(uint)i[lVar1 + lVar8]) &&
                      (iVar4 < (int)(uint)i[lVar2 + lVar8])) &&
                     (iVar4 < (int)(uint)i[lVar24 + lVar8])) {
                    uVar12 = (uint)i[lVar25 + lVar8];
                    goto LAB_00bdbe5e;
                  }
                }
              }
              else if (((((int)(uint)i[lVar13 + lVar8] < iVar11) &&
                        ((int)(uint)i[lVar2 + lVar8] < iVar11)) &&
                       ((int)(uint)i[lVar24 + lVar8] < iVar11)) &&
                      (((int)(uint)i[lVar25 + lVar8] < iVar11 &&
                       ((int)(uint)i[lVar14 + lVar8] < iVar11)))) {
                if (iVar11 <= (int)(uint)i[lVar1 + lVar8]) goto LAB_00bdbc58;
                if (iVar11 <= (int)(uint)i[lVar15 + lVar8]) goto LAB_00bdc251;
                if (iVar11 <= (int)(uint)i[lVar8 + 3]) goto LAB_00bdc383;
                goto LAB_00bdcff8;
              }
            }
            else if (iVar4 < (int)(uint)i[lVar13 + lVar8]) {
              if ((iVar4 < (int)(uint)i[lVar14 + lVar8]) && (iVar4 < (int)(uint)i[lVar8 + -3])) {
                if (iVar4 < (int)(uint)i[lVar3 + lVar8]) goto LAB_00bdb1f9;
                bVar5 = i[lVar8 + 3];
joined_r0x00bdc0ad:
                if (iVar4 < (int)(uint)bVar5) goto LAB_00bdc0b3;
              }
            }
            else if (((((int)(uint)i[lVar13 + lVar8] < iVar11) &&
                      ((int)(uint)i[lVar2 + lVar8] < iVar11)) &&
                     (((int)(uint)i[lVar24 + lVar8] < iVar11 &&
                      (((int)(uint)i[lVar25 + lVar8] < iVar11 &&
                       ((int)(uint)i[lVar14 + lVar8] < iVar11)))))) &&
                    ((int)(uint)i[lVar8 + -3] < iVar11)) {
              if (iVar11 <= (int)(uint)i[lVar1 + lVar8]) goto LAB_00bdbc65;
              if (iVar11 <= (int)(uint)i[lVar15 + lVar8]) goto LAB_00bdc25e;
              bVar5 = i[lVar8 + 3];
joined_r0x00bdb9f1:
              if (iVar11 <= (int)(uint)bVar5) goto LAB_00bdc6d5;
              goto LAB_00bdcff8;
            }
          }
          else if ((int)(uint)i[lVar7 + lVar8 + 2] < iVar11) {
            if (iVar4 < (int)(uint)i[lVar25 + lVar8]) {
              if ((iVar4 < (int)(uint)i[lVar13 + lVar8]) && (iVar4 < (int)(uint)i[lVar14 + lVar8]))
              {
                if ((int)(uint)i[lVar8 + -3] <= iVar4) {
                  bVar5 = i[lVar20 + lVar8 + 3];
                  goto joined_r0x00bdbca2;
                }
LAB_00bdaeec:
                if (iVar4 < (int)(uint)i[lVar3 + lVar8]) {
                  if (iVar4 < (int)(uint)i[lVar21 + lVar8]) {
                    if (iVar4 < (int)(uint)i[lVar22 + lVar8]) goto LAB_00bdcff8;
                  }
                  else {
LAB_00bdbcb5:
                    if ((int)(uint)i[lVar15 + lVar8] <= iVar4) goto LAB_00bdcff3;
                  }
                  if ((iVar4 < (int)(uint)i[lVar1 + lVar8]) && (iVar4 < (int)(uint)i[lVar2 + lVar8])
                     ) {
                    uVar12 = (uint)i[lVar24 + lVar8];
                    goto LAB_00bdbe5e;
                  }
                }
                else {
LAB_00bdbca8:
                  if (iVar4 < (int)(uint)i[lVar8 + 3]) goto LAB_00bdbcb5;
                }
              }
            }
            else if (((((int)(uint)i[lVar25 + lVar8] < iVar11) &&
                      ((int)(uint)i[lVar2 + lVar8] < iVar11)) &&
                     ((int)(uint)i[lVar24 + lVar8] < iVar11)) &&
                    ((int)(uint)i[lVar13 + lVar8] < iVar11)) {
              if (iVar11 <= (int)(uint)i[lVar1 + lVar8]) goto LAB_00bdbc45;
              if (iVar11 <= (int)(uint)i[lVar15 + lVar8]) goto LAB_00bdc23e;
              if (iVar11 <= (int)(uint)i[lVar8 + 3]) goto LAB_00bdc370;
              if (iVar11 <= (int)(uint)i[lVar20 + lVar8 + 3]) goto LAB_00bdbed5;
              goto LAB_00bdcff8;
            }
          }
          else if (iVar4 < (int)(uint)i[lVar25 + lVar8]) {
            if ((iVar4 < (int)(uint)i[lVar13 + lVar8]) && (iVar4 < (int)(uint)i[lVar14 + lVar8])) {
              if (iVar4 < (int)(uint)i[lVar8 + -3]) goto LAB_00bdaeec;
              bVar5 = i[lVar20 + lVar8 + 3];
joined_r0x00bdbca2:
              if (iVar4 < (int)(uint)bVar5) goto LAB_00bdbca8;
            }
          }
          else if (((((int)(uint)i[lVar25 + lVar8] < iVar11) &&
                    ((int)(uint)i[lVar2 + lVar8] < iVar11)) &&
                   ((int)(uint)i[lVar24 + lVar8] < iVar11)) &&
                  (((int)(uint)i[lVar13 + lVar8] < iVar11 && ((int)(uint)i[lVar14 + lVar8] < iVar11)
                   ))) {
            if ((int)(uint)i[lVar1 + lVar8] < iVar11) {
              if ((int)(uint)i[lVar15 + lVar8] < iVar11) {
                if (iVar11 <= (int)(uint)i[lVar8 + 3]) {
LAB_00bdc383:
                  bVar5 = i[lVar8 + -3];
                  goto joined_r0x00bdc063;
                }
                if ((int)(uint)i[lVar20 + lVar8 + 3] < iVar11) goto LAB_00bdcff8;
LAB_00bdc4df:
                uVar12 = (uint)i[lVar8 + -3];
LAB_00bdc968:
                if ((int)uVar12 < iVar11) goto LAB_00bdcff8;
              }
              else {
LAB_00bdc251:
                if ((int)(uint)i[lVar8 + -3] < iVar11) {
LAB_00bdc25e:
                  bVar5 = i[lVar3 + lVar8];
                  lVar27 = lVar21;
                  goto joined_r0x00bdc063;
                }
              }
            }
            else {
LAB_00bdbc58:
              if ((int)(uint)i[lVar8 + -3] < iVar11) {
LAB_00bdbc65:
                bVar5 = i[lVar3 + lVar8];
joined_r0x00bdbaf7:
                if ((int)(uint)bVar5 < iVar11) {
LAB_00bdbc7d:
                  bVar5 = i[lVar16 + lVar8];
                  lVar27 = lVar22;
                  goto joined_r0x00bdc063;
                }
              }
            }
          }
          goto LAB_00bdcff3;
        }
        if (iVar11 <= (int)(uint)i[lVar6 + lVar8 + 1]) {
          if (iVar4 < (int)(uint)i[lVar24 + lVar8]) {
            if ((iVar4 < (int)(uint)i[lVar25 + lVar8]) && (iVar4 < (int)(uint)i[lVar13 + lVar8])) {
              if (iVar4 < (int)(uint)i[lVar14 + lVar8]) goto LAB_00bdac55;
              bVar5 = i[lVar7 + lVar8 + 2];
joined_r0x00bdb781:
              if (iVar4 < (int)(uint)bVar5) {
LAB_00bdb787:
                if (iVar4 < (int)(uint)i[lVar20 + lVar8 + 3]) {
LAB_00bdb79a:
                  if (iVar4 < (int)(uint)i[lVar8 + 3]) {
LAB_00bdb7a7:
                    if (iVar4 < (int)(uint)i[lVar15 + lVar8]) goto LAB_00bdb7ba;
                  }
                }
              }
            }
          }
          else if (((((int)(uint)i[lVar24 + lVar8] < iVar11) &&
                    ((int)(uint)i[lVar2 + lVar8] < iVar11)) &&
                   ((int)(uint)i[lVar25 + lVar8] < iVar11)) &&
                  ((int)(uint)i[lVar13 + lVar8] < iVar11)) {
            if ((int)(uint)i[lVar1 + lVar8] < iVar11) {
              if ((int)(uint)i[lVar15 + lVar8] < iVar11) {
                if ((int)(uint)i[lVar8 + 3] < iVar11) {
                  if ((int)(uint)i[lVar20 + lVar8 + 3] < iVar11) {
                    bVar5 = i[lVar7 + lVar8 + 2];
                    lVar27 = lVar14;
                    goto joined_r0x00bdb9f1;
                  }
LAB_00bdbed5:
                  bVar5 = i[lVar26 + lVar8];
joined_r0x00bdc4d9:
                  if ((int)(uint)bVar5 < iVar11) goto LAB_00bdc4df;
                }
                else {
LAB_00bdc370:
                  if ((int)(uint)i[lVar14 + lVar8] < iVar11) goto LAB_00bdc383;
                }
              }
              else {
LAB_00bdc23e:
                if ((int)(uint)i[lVar14 + lVar8] < iVar11) goto LAB_00bdc251;
              }
            }
            else {
LAB_00bdbc45:
              if ((int)(uint)i[lVar14 + lVar8] < iVar11) goto LAB_00bdbc58;
            }
          }
          goto LAB_00bdcff3;
        }
        if ((int)(uint)i[lVar24 + lVar8] <= iVar4) {
          if ((((int)(uint)i[lVar24 + lVar8] < iVar11) && ((int)(uint)i[lVar2 + lVar8] < iVar11)) &&
             ((int)(uint)i[lVar25 + lVar8] < iVar11)) {
            if ((int)(uint)i[lVar1 + lVar8] < iVar11) {
              if ((int)(uint)i[lVar15 + lVar8] < iVar11) {
                if ((int)(uint)i[lVar8 + 3] < iVar11) {
                  if (iVar11 <= (int)(uint)i[lVar20 + lVar8 + 3]) goto LAB_00bdbebd;
                  if ((int)(uint)i[lVar7 + lVar8 + 2] < iVar11) goto LAB_00bdcff8;
LAB_00bdae92:
                  bVar5 = i[lVar13 + lVar8];
                  lVar27 = lVar14;
                  goto joined_r0x00bdc063;
                }
LAB_00bdc35d:
                if ((int)(uint)i[lVar13 + lVar8] < iVar11) goto LAB_00bdc370;
              }
              else {
LAB_00bdc22b:
                if ((int)(uint)i[lVar13 + lVar8] < iVar11) goto LAB_00bdc23e;
              }
            }
            else if ((int)(uint)i[lVar13 + lVar8] < iVar11) goto LAB_00bdbc45;
          }
          goto LAB_00bdcff3;
        }
        if (((int)(uint)i[lVar25 + lVar8] <= iVar4) || ((int)(uint)i[lVar13 + lVar8] <= iVar4))
        goto LAB_00bdcff3;
        if ((int)(uint)i[lVar14 + lVar8] <= iVar4) {
          bVar5 = i[lVar7 + lVar8 + 2];
          goto joined_r0x00bdb781;
        }
LAB_00bdac55:
        if ((int)(uint)i[lVar8 + -3] <= iVar4) goto LAB_00bdb787;
        if ((int)(uint)i[lVar3 + lVar8] <= iVar4) goto LAB_00bdb79a;
        if ((int)(uint)i[lVar21 + lVar8] <= iVar4) goto LAB_00bdb7a7;
        if (iVar4 < (int)(uint)i[lVar22 + lVar8]) goto LAB_00bdcff8;
LAB_00bdb7ba:
        if ((int)(uint)i[lVar1 + lVar8] <= iVar4) goto LAB_00bdcff3;
        uVar12 = (uint)i[lVar2 + lVar8];
LAB_00bdbe5e:
        if ((int)uVar12 <= iVar4) goto LAB_00bdcff3;
      }
      else {
        lVar27 = lVar13;
        if (iVar11 <= (int)(uint)i[lVar6 + lVar8]) {
          if (iVar4 < (int)(uint)i[lVar2 + lVar8]) {
            if ((iVar4 < (int)(uint)i[lVar24 + lVar8]) && (iVar4 < (int)(uint)i[lVar25 + lVar8])) {
              if (iVar4 < (int)(uint)i[lVar1 + lVar8]) {
                if (iVar4 < (int)(uint)i[lVar15 + lVar8]) {
                  if (iVar4 < (int)(uint)i[lVar8 + 3]) {
                    if (iVar4 < (int)(uint)i[lVar20 + lVar8 + 3]) {
                      if (iVar4 < (int)(uint)i[lVar7 + lVar8 + 2]) {
                        if (iVar4 < (int)(uint)i[lVar6 + lVar8 + 1]) goto LAB_00bdcff8;
                      }
                      else {
                        lVar17 = lVar14;
                        if ((int)(uint)i[lVar13 + lVar8] <= iVar4) goto LAB_00bdcff3;
                      }
LAB_00bdbe58:
                      uVar12 = (uint)i[lVar17 + lVar8];
                      goto LAB_00bdbe5e;
                    }
                    if (iVar4 < (int)(uint)i[lVar13 + lVar8]) {
LAB_00bdc01e:
                      bVar5 = i[lVar14 + lVar8];
joined_r0x00bdc8b9:
                      if (iVar4 < (int)(uint)bVar5) {
LAB_00bdc8bf:
                        uVar12 = (uint)i[lVar8 + -3];
                        goto LAB_00bdbe5e;
                      }
                    }
                  }
                  else if (iVar4 < (int)(uint)i[lVar13 + lVar8]) {
                    bVar5 = i[lVar14 + lVar8];
joined_r0x00bdc6ed:
                    if (iVar4 < (int)(uint)bVar5) {
LAB_00bdbb7d:
                      bVar5 = i[lVar8 + -3];
                      lVar17 = lVar3;
                      goto joined_r0x00bdbb47;
                    }
                  }
                }
                else if ((iVar4 < (int)(uint)i[lVar13 + lVar8]) &&
                        (iVar4 < (int)(uint)i[lVar14 + lVar8])) {
                  bVar5 = i[lVar8 + -3];
                  goto joined_r0x00bdc503;
                }
              }
              else if (((iVar4 < (int)(uint)i[lVar13 + lVar8]) &&
                       (iVar4 < (int)(uint)i[lVar14 + lVar8])) && (iVar4 < (int)(uint)i[lVar8 + -3])
                      ) {
                bVar5 = i[lVar3 + lVar8];
                goto joined_r0x00bdc992;
              }
            }
          }
          else if ((((int)(uint)i[lVar2 + lVar8] < iVar11) &&
                   ((int)(uint)i[lVar24 + lVar8] < iVar11)) &&
                  ((int)(uint)i[lVar25 + lVar8] < iVar11)) {
            if ((int)(uint)i[lVar1 + lVar8] < iVar11) {
              if ((int)(uint)i[lVar15 + lVar8] < iVar11) {
                if ((int)(uint)i[lVar8 + 3] < iVar11) {
                  if ((int)(uint)i[lVar20 + lVar8 + 3] < iVar11) {
                    if ((int)(uint)i[lVar7 + lVar8 + 2] < iVar11) {
                      if ((int)(uint)i[lVar6 + lVar8 + 1] < iVar11) goto LAB_00bdcff8;
                    }
                    else {
                      lVar27 = lVar14;
                      if (iVar11 <= (int)(uint)i[lVar13 + lVar8]) goto LAB_00bdcff3;
                    }
LAB_00bdc6d5:
                    uVar12 = (uint)i[lVar27 + lVar8];
                    goto LAB_00bdc968;
                  }
                  if ((int)(uint)i[lVar13 + lVar8] < iVar11) {
                    bVar5 = i[lVar14 + lVar8];
                    goto joined_r0x00bdc4d9;
                  }
                }
                else if (((int)(uint)i[lVar13 + lVar8] < iVar11) &&
                        ((int)(uint)i[lVar14 + lVar8] < iVar11)) {
                  bVar5 = i[lVar8 + -3];
                  lVar27 = lVar3;
                  goto joined_r0x00bdc063;
                }
              }
              else if ((((int)(uint)i[lVar13 + lVar8] < iVar11) &&
                       ((int)(uint)i[lVar14 + lVar8] < iVar11)) &&
                      ((int)(uint)i[lVar8 + -3] < iVar11)) {
                bVar5 = i[lVar3 + lVar8];
                lVar27 = lVar21;
                goto joined_r0x00bdc063;
              }
            }
            else if (((((int)(uint)i[lVar13 + lVar8] < iVar11) &&
                      ((int)(uint)i[lVar14 + lVar8] < iVar11)) &&
                     ((int)(uint)i[lVar8 + -3] < iVar11)) && ((int)(uint)i[lVar3 + lVar8] < iVar11))
            {
              bVar5 = i[lVar21 + lVar8];
              lVar27 = lVar22;
joined_r0x00bdc063:
              if ((int)(uint)bVar5 < iVar11) goto LAB_00bdc6d5;
            }
          }
          goto LAB_00bdcff3;
        }
        lVar17 = lVar14;
        if (iVar4 < (int)(uint)i[lVar6 + lVar8 + 1]) {
          if (iVar4 < (int)(uint)i[lVar24 + lVar8]) {
            if ((iVar4 < (int)(uint)i[lVar2 + lVar8]) && (iVar4 < (int)(uint)i[lVar25 + lVar8])) {
              if (iVar4 < (int)(uint)i[lVar1 + lVar8]) {
                if (iVar4 < (int)(uint)i[lVar15 + lVar8]) {
                  if (iVar4 < (int)(uint)i[lVar8 + 3]) {
                    if (iVar4 < (int)(uint)i[lVar20 + lVar8 + 3]) {
                      if (iVar4 < (int)(uint)i[lVar7 + lVar8 + 2]) goto LAB_00bdcff8;
LAB_00bdaa02:
                      bVar5 = i[lVar13 + lVar8];
                      lVar17 = lVar14;
                      goto joined_r0x00bdbb47;
                    }
LAB_00bdc899:
                    bVar5 = i[lVar13 + lVar8];
joined_r0x00bdc5d1:
                    if (iVar4 < (int)(uint)bVar5) {
LAB_00bdc8b1:
                      bVar5 = i[lVar17 + lVar8];
                      goto joined_r0x00bdc8b9;
                    }
                  }
                  else {
LAB_00bdccf1:
                    if (iVar4 < (int)(uint)i[lVar13 + lVar8]) {
LAB_00bdcd04:
                      if (iVar4 < (int)(uint)i[lVar14 + lVar8]) {
LAB_00bdcd17:
                        bVar5 = i[lVar8 + -3];
                        lVar17 = lVar3;
                        goto joined_r0x00bdbb47;
                      }
                    }
                  }
                }
                else if (iVar4 < (int)(uint)i[lVar13 + lVar8]) {
LAB_00bdbb1a:
                  bVar5 = i[lVar14 + lVar8];
joined_r0x00bdce39:
                  if (iVar4 < (int)(uint)bVar5) {
LAB_00bdbb2d:
                    if (iVar4 < (int)(uint)i[lVar8 + -3]) {
LAB_00bdbb3a:
                      bVar5 = i[lVar3 + lVar8];
                      lVar17 = lVar21;
                      goto joined_r0x00bdbb47;
                    }
                  }
                }
              }
              else if (iVar4 < (int)(uint)i[lVar13 + lVar8]) {
                bVar5 = i[lVar14 + lVar8];
joined_r0x00bdc4ae:
                if (iVar4 < (int)(uint)bVar5) {
LAB_00bdb709:
                  if (iVar4 < (int)(uint)i[lVar8 + -3]) {
                    bVar5 = i[lVar3 + lVar8];
                    goto joined_r0x00bdcca5;
                  }
                }
              }
            }
          }
          else if ((((int)(uint)i[lVar24 + lVar8] < iVar11) &&
                   ((int)(uint)i[lVar25 + lVar8] < iVar11)) &&
                  ((int)(uint)i[lVar13 + lVar8] < iVar11)) {
            if ((int)(uint)i[lVar14 + lVar8] < iVar11) {
              if ((int)(uint)i[lVar8 + -3] < iVar11) {
                if ((int)(uint)i[lVar3 + lVar8] < iVar11) {
                  if (iVar11 <= (int)(uint)i[lVar21 + lVar8]) goto LAB_00bdbc08;
                  if ((int)(uint)i[lVar22 + lVar8] < iVar11) goto LAB_00bdcff8;
LAB_00bdbc1b:
                  bVar5 = i[lVar1 + lVar8];
                  goto joined_r0x00bdbc27;
                }
LAB_00bdbbfb:
                if ((int)(uint)i[lVar8 + 3] < iVar11) {
LAB_00bdbc08:
                  if ((int)(uint)i[lVar15 + lVar8] < iVar11) goto LAB_00bdbc1b;
                }
              }
              else {
LAB_00bdbbe8:
                if ((int)(uint)i[lVar20 + lVar8 + 3] < iVar11) goto LAB_00bdbbfb;
              }
            }
            else if ((int)(uint)i[lVar7 + lVar8 + 2] < iVar11) goto LAB_00bdbbe8;
          }
        }
        else if ((int)(uint)i[lVar6 + lVar8 + 1] < iVar11) {
          if (iVar4 < (int)(uint)i[lVar7 + lVar8 + 2]) {
            if (iVar4 < (int)(uint)i[lVar25 + lVar8]) {
              if (((iVar4 < (int)(uint)i[lVar2 + lVar8]) && (iVar4 < (int)(uint)i[lVar24 + lVar8]))
                 && (iVar4 < (int)(uint)i[lVar13 + lVar8])) {
                if ((int)(uint)i[lVar1 + lVar8] <= iVar4) {
                  bVar5 = i[lVar14 + lVar8];
                  goto joined_r0x00bdc4ae;
                }
                if ((int)(uint)i[lVar15 + lVar8] <= iVar4) goto LAB_00bdbb1a;
                if ((int)(uint)i[lVar8 + 3] <= iVar4) goto LAB_00bdcd04;
                if ((int)(uint)i[lVar20 + lVar8 + 3] <= iVar4) goto LAB_00bdc8b1;
                goto LAB_00bdcff8;
              }
            }
            else if ((((int)(uint)i[lVar25 + lVar8] < iVar11) &&
                     ((int)(uint)i[lVar13 + lVar8] < iVar11)) &&
                    ((int)(uint)i[lVar14 + lVar8] < iVar11)) {
              if ((int)(uint)i[lVar8 + -3] < iVar11) {
                if ((int)(uint)i[lVar3 + lVar8] < iVar11) {
                  if (iVar11 <= (int)(uint)i[lVar21 + lVar8]) goto LAB_00bdc72a;
                  if ((int)(uint)i[lVar22 + lVar8] < iVar11) goto LAB_00bdcff8;
                }
                else {
                  if (iVar11 <= (int)(uint)i[lVar8 + 3]) goto LAB_00bdcff3;
LAB_00bdc72a:
                  if (iVar11 <= (int)(uint)i[lVar15 + lVar8]) goto LAB_00bdcff3;
                }
                if (((int)(uint)i[lVar1 + lVar8] < iVar11) && ((int)(uint)i[lVar2 + lVar8] < iVar11)
                   ) {
LAB_00bdcb9a:
                  uVar12 = (uint)i[lVar24 + lVar8];
                  goto LAB_00bdc968;
                }
              }
              else if (((int)(uint)i[lVar20 + lVar8 + 3] < iVar11) &&
                      ((int)(uint)i[lVar8 + 3] < iVar11)) goto LAB_00bdc72a;
            }
          }
          else if ((int)(uint)i[lVar7 + lVar8 + 2] < iVar11) {
            if (iVar4 < (int)(uint)i[lVar20 + lVar8 + 3]) {
              if (iVar4 < (int)(uint)i[lVar13 + lVar8]) {
                if (((iVar4 < (int)(uint)i[lVar2 + lVar8]) && (iVar4 < (int)(uint)i[lVar24 + lVar8])
                    ) && ((iVar4 < (int)(uint)i[lVar25 + lVar8] &&
                          (iVar4 < (int)(uint)i[lVar14 + lVar8])))) {
                  if ((int)(uint)i[lVar1 + lVar8] <= iVar4) goto LAB_00bdb709;
                  if ((int)(uint)i[lVar15 + lVar8] <= iVar4) goto LAB_00bdbb2d;
                  if ((int)(uint)i[lVar8 + 3] <= iVar4) goto LAB_00bdcd17;
                  goto LAB_00bdcff8;
                }
              }
              else if ((((int)(uint)i[lVar13 + lVar8] < iVar11) &&
                       ((int)(uint)i[lVar14 + lVar8] < iVar11)) &&
                      ((int)(uint)i[lVar8 + -3] < iVar11)) {
                if ((int)(uint)i[lVar3 + lVar8] < iVar11) {
                  if ((int)(uint)i[lVar21 + lVar8] < iVar11) {
                    if ((int)(uint)i[lVar22 + lVar8] < iVar11) goto LAB_00bdcff8;
                  }
                  else {
                    bVar5 = i[lVar15 + lVar8];
joined_r0x00bdc9ee:
                    if (iVar11 <= (int)(uint)bVar5) goto LAB_00bdcff3;
                  }
                  if (((int)(uint)i[lVar1 + lVar8] < iVar11) &&
                     ((int)(uint)i[lVar2 + lVar8] < iVar11)) {
                    bVar5 = i[lVar24 + lVar8];
joined_r0x00bdcdde:
                    if ((int)(uint)bVar5 < iVar11) {
                      uVar12 = (uint)i[lVar25 + lVar8];
                      goto LAB_00bdc968;
                    }
                  }
                }
                else if ((int)(uint)i[lVar8 + 3] < iVar11) {
                  bVar5 = i[lVar15 + lVar8];
                  goto joined_r0x00bdc9ee;
                }
              }
            }
            else if ((int)(uint)i[lVar20 + lVar8 + 3] < iVar11) {
              if (iVar4 < (int)(uint)i[lVar8 + 3]) {
                if (iVar4 < (int)(uint)i[lVar3 + lVar8]) {
                  if (((iVar4 < (int)(uint)i[lVar2 + lVar8]) &&
                      (iVar4 < (int)(uint)i[lVar24 + lVar8])) &&
                     ((iVar4 < (int)(uint)i[lVar25 + lVar8] &&
                      ((iVar4 < (int)(uint)i[lVar13 + lVar8] &&
                       (iVar4 < (int)(uint)i[lVar14 + lVar8])))))) {
                    bVar5 = i[lVar8 + -3];
LAB_00bdc68b:
                    if (iVar4 < (int)(uint)bVar5) {
                      if ((int)(uint)i[lVar1 + lVar8] <= iVar4) goto LAB_00bdbe45;
                      bVar5 = i[lVar15 + lVar8];
                      lVar17 = lVar21;
                      goto joined_r0x00bdafb5;
                    }
                  }
                }
                else if ((int)(uint)i[lVar3 + lVar8] < iVar11) {
                  if (iVar4 < (int)(uint)i[lVar14 + lVar8]) {
                    if ((((iVar4 < (int)(uint)i[lVar15 + lVar8]) &&
                         (iVar4 < (int)(uint)i[lVar1 + lVar8])) &&
                        (iVar4 < (int)(uint)i[lVar2 + lVar8])) &&
                       (iVar4 < (int)(uint)i[lVar24 + lVar8])) {
                      bVar5 = i[lVar25 + lVar8];
                      lVar17 = lVar13;
                      goto joined_r0x00bdc5d1;
                    }
                  }
                  else if (((int)(uint)i[lVar14 + lVar8] < iVar11) &&
                          ((int)(uint)i[lVar8 + -3] < iVar11)) {
                    if ((int)(uint)i[lVar21 + lVar8] < iVar11) {
                      if ((int)(uint)i[lVar22 + lVar8] < iVar11) goto LAB_00bdcff8;
                      bVar5 = i[lVar1 + lVar8];
                    }
                    else {
                      if (iVar11 <= (int)(uint)i[lVar15 + lVar8]) goto LAB_00bdcff3;
                      bVar5 = i[lVar1 + lVar8];
                    }
                    if (((int)(uint)bVar5 < iVar11) && ((int)(uint)i[lVar2 + lVar8] < iVar11)) {
                      bVar5 = i[lVar24 + lVar8];
joined_r0x00bdcf7f:
                      if ((int)(uint)bVar5 < iVar11) {
                        bVar5 = i[lVar25 + lVar8];
                        goto joined_r0x00bdc063;
                      }
                    }
                  }
                }
                else if ((((iVar4 < (int)(uint)i[lVar15 + lVar8]) &&
                          (iVar4 < (int)(uint)i[lVar1 + lVar8])) &&
                         (iVar4 < (int)(uint)i[lVar2 + lVar8])) &&
                        ((iVar4 < (int)(uint)i[lVar24 + lVar8] &&
                         (iVar4 < (int)(uint)i[lVar25 + lVar8])))) goto LAB_00bdc899;
              }
              else if ((int)(uint)i[lVar8 + 3] < iVar11) {
                if (iVar4 < (int)(uint)i[lVar15 + lVar8]) {
                  if (iVar4 < (int)(uint)i[lVar21 + lVar8]) {
                    if ((((iVar4 < (int)(uint)i[lVar2 + lVar8]) &&
                         (iVar4 < (int)(uint)i[lVar24 + lVar8])) &&
                        ((iVar4 < (int)(uint)i[lVar25 + lVar8] &&
                         ((iVar4 < (int)(uint)i[lVar13 + lVar8] &&
                          (iVar4 < (int)(uint)i[lVar14 + lVar8])))))) &&
                       (iVar4 < (int)(uint)i[lVar8 + -3])) {
                      bVar5 = i[lVar3 + lVar8];
joined_r0x00bdcb40:
                      if (iVar4 < (int)(uint)bVar5) {
                        bVar5 = i[lVar1 + lVar8];
                        lVar17 = lVar22;
                        goto joined_r0x00bdafb5;
                      }
                    }
                  }
                  else if ((int)(uint)i[lVar21 + lVar8] < iVar11) {
                    if (iVar4 < (int)(uint)i[lVar8 + -3]) {
                      if (((iVar4 < (int)(uint)i[lVar1 + lVar8]) &&
                          (((iVar4 < (int)(uint)i[lVar2 + lVar8] &&
                            (iVar4 < (int)(uint)i[lVar24 + lVar8])) &&
                           (iVar4 < (int)(uint)i[lVar25 + lVar8])))) &&
                         (iVar4 < (int)(uint)i[lVar13 + lVar8])) {
                        bVar5 = i[lVar14 + lVar8];
                        lVar17 = lVar3;
                        goto joined_r0x00bdbb47;
                      }
                    }
                    else if (((int)(uint)i[lVar8 + -3] < iVar11) &&
                            ((int)(uint)i[lVar3 + lVar8] < iVar11)) {
                      if ((int)(uint)i[lVar22 + lVar8] < iVar11) goto LAB_00bdcff8;
                      if (((int)(uint)i[lVar1 + lVar8] < iVar11) &&
                         ((int)(uint)i[lVar2 + lVar8] < iVar11)) {
                        bVar5 = i[lVar24 + lVar8];
                        goto joined_r0x00bdcd98;
                      }
                    }
                  }
                  else if (((iVar4 < (int)(uint)i[lVar1 + lVar8]) &&
                           (iVar4 < (int)(uint)i[lVar2 + lVar8])) &&
                          ((iVar4 < (int)(uint)i[lVar24 + lVar8] &&
                           (iVar4 < (int)(uint)i[lVar25 + lVar8])))) goto LAB_00bdccf1;
                }
                else if ((int)(uint)i[lVar15 + lVar8] < iVar11) {
                  if (iVar4 < (int)(uint)i[lVar1 + lVar8]) {
                    if ((int)(uint)i[lVar22 + lVar8] < iVar11) {
                      bVar5 = i[lVar3 + lVar8];
                      lVar27 = lVar21;
                      if ((int)(uint)bVar5 <= iVar4) goto joined_r0x00bdc063;
                      if ((((iVar4 < (int)(uint)i[lVar2 + lVar8]) &&
                           (iVar4 < (int)(uint)i[lVar24 + lVar8])) &&
                          (iVar4 < (int)(uint)i[lVar25 + lVar8])) &&
                         ((iVar4 < (int)(uint)i[lVar13 + lVar8] &&
                          (iVar4 < (int)(uint)i[lVar14 + lVar8])))) {
                        bVar5 = i[lVar8 + -3];
                        lVar17 = lVar21;
                        goto joined_r0x00bdbb47;
                      }
                    }
                    else if (((iVar4 < (int)(uint)i[lVar2 + lVar8]) &&
                             (iVar4 < (int)(uint)i[lVar24 + lVar8])) &&
                            ((iVar4 < (int)(uint)i[lVar25 + lVar8] &&
                             (iVar4 < (int)(uint)i[lVar13 + lVar8])))) {
                      bVar5 = i[lVar14 + lVar8];
                      goto joined_r0x00bdce39;
                    }
                  }
                  else if ((int)(uint)i[lVar1 + lVar8] < iVar11) {
                    if ((int)(uint)i[lVar2 + lVar8] <= iVar4) {
                      if ((int)(uint)i[lVar2 + lVar8] < iVar11) {
                        bVar5 = i[lVar24 + lVar8];
                        lVar27 = lVar22;
                        goto joined_r0x00bdb9f1;
                      }
                      goto LAB_00bdbc7d;
                    }
                    bVar5 = i[lVar21 + lVar8];
                    lVar27 = lVar22;
                    if ((int)(uint)bVar5 <= iVar4) goto joined_r0x00bdc063;
                    if (((iVar4 < (int)(uint)i[lVar24 + lVar8]) &&
                        (iVar4 < (int)(uint)i[lVar25 + lVar8])) &&
                       ((iVar4 < (int)(uint)i[lVar13 + lVar8] &&
                        (iVar4 < (int)(uint)i[lVar14 + lVar8])))) {
                      bVar5 = i[lVar8 + -3];
                      lVar16 = lVar3;
                      goto joined_r0x00bdcca5;
                    }
                  }
                  else {
                    bVar5 = i[lVar3 + lVar8];
                    if ((int)(uint)bVar5 <= iVar4) goto joined_r0x00bdbaf7;
                    if ((((iVar4 < (int)(uint)i[lVar2 + lVar8]) &&
                         (iVar4 < (int)(uint)i[lVar24 + lVar8])) &&
                        (iVar4 < (int)(uint)i[lVar25 + lVar8])) &&
                       ((iVar4 < (int)(uint)i[lVar13 + lVar8] &&
                        (iVar4 < (int)(uint)i[lVar14 + lVar8])))) {
                      bVar5 = i[lVar8 + -3];
joined_r0x00bdcca5:
                      if (iVar4 < (int)(uint)bVar5) goto LAB_00bdbe45;
                    }
                  }
                }
                else if (iVar4 < (int)(uint)i[lVar8 + -3]) {
                  if ((((iVar4 < (int)(uint)i[lVar2 + lVar8]) &&
                       (iVar4 < (int)(uint)i[lVar24 + lVar8])) &&
                      (iVar4 < (int)(uint)i[lVar25 + lVar8])) &&
                     (((iVar4 < (int)(uint)i[lVar13 + lVar8] &&
                       (iVar4 < (int)(uint)i[lVar14 + lVar8])) &&
                      (iVar4 < (int)(uint)i[lVar3 + lVar8])))) {
                    bVar5 = i[lVar21 + lVar8];
                    goto joined_r0x00bdcb40;
                  }
                }
                else if ((((int)(uint)i[lVar8 + -3] < iVar11) &&
                         ((int)(uint)i[lVar3 + lVar8] < iVar11)) &&
                        ((int)(uint)i[lVar21 + lVar8] < iVar11)) {
                  if ((int)(uint)i[lVar22 + lVar8] < iVar11) goto LAB_00bdcff8;
                  if (((int)(uint)i[lVar1 + lVar8] < iVar11) &&
                     ((int)(uint)i[lVar2 + lVar8] < iVar11)) {
                    bVar5 = i[lVar24 + lVar8];
joined_r0x00bdcd98:
                    if (((int)(uint)bVar5 < iVar11) && ((int)(uint)i[lVar25 + lVar8] < iVar11))
                    goto LAB_00bdae92;
                  }
                }
              }
              else if (iVar4 < (int)(uint)i[lVar14 + lVar8]) {
                if ((((iVar4 < (int)(uint)i[lVar2 + lVar8]) &&
                     (iVar4 < (int)(uint)i[lVar24 + lVar8])) &&
                    (iVar4 < (int)(uint)i[lVar25 + lVar8])) &&
                   ((iVar4 < (int)(uint)i[lVar13 + lVar8] && (iVar4 < (int)(uint)i[lVar8 + -3])))) {
                  bVar5 = i[lVar3 + lVar8];
                  goto LAB_00bdc68b;
                }
              }
              else if ((((int)(uint)i[lVar14 + lVar8] < iVar11) &&
                       ((int)(uint)i[lVar8 + -3] < iVar11)) &&
                      ((int)(uint)i[lVar3 + lVar8] < iVar11)) {
                if ((int)(uint)i[lVar21 + lVar8] < iVar11) {
                  if ((int)(uint)i[lVar22 + lVar8] < iVar11) goto LAB_00bdcff8;
                  if ((int)(uint)i[lVar1 + lVar8] < iVar11) {
                    bVar5 = i[lVar2 + lVar8];
                    goto joined_r0x00bdcf75;
                  }
                }
                else if (((int)(uint)i[lVar15 + lVar8] < iVar11) &&
                        ((int)(uint)i[lVar1 + lVar8] < iVar11)) {
                  bVar5 = i[lVar2 + lVar8];
joined_r0x00bdcf75:
                  if ((int)(uint)bVar5 < iVar11) {
                    bVar5 = i[lVar24 + lVar8];
                    goto joined_r0x00bdcf7f;
                  }
                }
              }
            }
            else if (iVar4 < (int)(uint)i[lVar13 + lVar8]) {
              if ((((iVar4 < (int)(uint)i[lVar2 + lVar8]) && (iVar4 < (int)(uint)i[lVar24 + lVar8]))
                  && (iVar4 < (int)(uint)i[lVar25 + lVar8])) &&
                 ((iVar4 < (int)(uint)i[lVar14 + lVar8] && (iVar4 < (int)(uint)i[lVar8 + -3])))) {
                if (iVar4 < (int)(uint)i[lVar1 + lVar8]) {
                  if (iVar4 < (int)(uint)i[lVar15 + lVar8]) {
                    bVar5 = i[lVar8 + 3];
                    lVar17 = lVar3;
                    goto joined_r0x00bdafb5;
                  }
                  goto LAB_00bdbb3a;
                }
                bVar5 = i[lVar3 + lVar8];
joined_r0x00bdc992:
                if (iVar4 < (int)(uint)bVar5) {
                  bVar5 = i[lVar21 + lVar8];
                  lVar17 = lVar22;
                  goto joined_r0x00bdbb47;
                }
              }
            }
            else if ((((int)(uint)i[lVar13 + lVar8] < iVar11) &&
                     ((int)(uint)i[lVar14 + lVar8] < iVar11)) && ((int)(uint)i[lVar8 + -3] < iVar11)
                    ) {
              if ((int)(uint)i[lVar3 + lVar8] < iVar11) {
                if ((int)(uint)i[lVar21 + lVar8] < iVar11) {
                  if ((int)(uint)i[lVar22 + lVar8] < iVar11) goto LAB_00bdcff8;
                  if ((iVar11 <= (int)(uint)i[lVar1 + lVar8]) ||
                     (iVar11 <= (int)(uint)i[lVar2 + lVar8])) goto LAB_00bdcff3;
LAB_00bdcdd6:
                  bVar5 = i[lVar24 + lVar8];
                  goto joined_r0x00bdcdde;
                }
                if (((int)(uint)i[lVar15 + lVar8] < iVar11) &&
                   ((int)(uint)i[lVar1 + lVar8] < iVar11)) {
                  bVar5 = i[lVar2 + lVar8];
                  goto joined_r0x00bdcc25;
                }
              }
              else if ((((int)(uint)i[lVar8 + 3] < iVar11) &&
                       ((int)(uint)i[lVar15 + lVar8] < iVar11)) &&
                      ((int)(uint)i[lVar1 + lVar8] < iVar11)) {
                bVar5 = i[lVar2 + lVar8];
joined_r0x00bdcc25:
                if ((int)(uint)bVar5 < iVar11) goto LAB_00bdcdd6;
              }
            }
          }
          else if (iVar4 < (int)(uint)i[lVar25 + lVar8]) {
            if (((iVar4 < (int)(uint)i[lVar2 + lVar8]) && (iVar4 < (int)(uint)i[lVar24 + lVar8])) &&
               ((iVar4 < (int)(uint)i[lVar13 + lVar8] && (iVar4 < (int)(uint)i[lVar14 + lVar8])))) {
              if (iVar4 < (int)(uint)i[lVar1 + lVar8]) {
                if ((int)(uint)i[lVar15 + lVar8] <= iVar4) {
                  bVar5 = i[lVar8 + -3];
                  goto joined_r0x00bdc503;
                }
                if ((int)(uint)i[lVar8 + 3] <= iVar4) goto LAB_00bdbb7d;
                if ((int)(uint)i[lVar20 + lVar8 + 3] <= iVar4) goto LAB_00bdc8bf;
                goto LAB_00bdcff8;
              }
              if (iVar4 < (int)(uint)i[lVar8 + -3]) {
                bVar5 = i[lVar3 + lVar8];
                goto joined_r0x00bdc992;
              }
            }
          }
          else if ((((int)(uint)i[lVar25 + lVar8] < iVar11) &&
                   ((int)(uint)i[lVar13 + lVar8] < iVar11)) &&
                  ((int)(uint)i[lVar14 + lVar8] < iVar11)) {
            if ((int)(uint)i[lVar8 + -3] < iVar11) {
              if ((int)(uint)i[lVar3 + lVar8] < iVar11) {
                if ((int)(uint)i[lVar21 + lVar8] < iVar11) {
                  if ((int)(uint)i[lVar22 + lVar8] < iVar11) goto LAB_00bdcff8;
                  bVar5 = i[lVar1 + lVar8];
joined_r0x00bdc9c9:
                  if ((int)(uint)bVar5 < iVar11) goto LAB_00bdcb8c;
                }
                else if ((int)(uint)i[lVar15 + lVar8] < iVar11) {
                  bVar5 = i[lVar1 + lVar8];
                  goto joined_r0x00bdc7a1;
                }
              }
              else if (((int)(uint)i[lVar8 + 3] < iVar11) && ((int)(uint)i[lVar15 + lVar8] < iVar11)
                      ) {
                bVar5 = i[lVar1 + lVar8];
                goto joined_r0x00bdc9c9;
              }
            }
            else if ((((int)(uint)i[lVar20 + lVar8 + 3] < iVar11) &&
                     ((int)(uint)i[lVar8 + 3] < iVar11)) && ((int)(uint)i[lVar15 + lVar8] < iVar11))
            {
              bVar5 = i[lVar1 + lVar8];
joined_r0x00bdc7a1:
              if (iVar11 <= (int)(uint)bVar5) goto LAB_00bdcff3;
LAB_00bdcb8c:
              if (iVar11 <= (int)(uint)i[lVar2 + lVar8]) goto LAB_00bdcff3;
              goto LAB_00bdcb9a;
            }
          }
        }
        else if (iVar4 < (int)(uint)i[lVar24 + lVar8]) {
          if (((iVar4 < (int)(uint)i[lVar2 + lVar8]) && (iVar4 < (int)(uint)i[lVar25 + lVar8])) &&
             (iVar4 < (int)(uint)i[lVar13 + lVar8])) {
            if (iVar4 < (int)(uint)i[lVar1 + lVar8]) {
              if (iVar4 < (int)(uint)i[lVar15 + lVar8]) {
                if ((int)(uint)i[lVar8 + 3] <= iVar4) {
                  bVar5 = i[lVar14 + lVar8];
                  goto joined_r0x00bdc6ed;
                }
                if ((int)(uint)i[lVar20 + lVar8 + 3] <= iVar4) goto LAB_00bdc01e;
                bVar5 = i[lVar7 + lVar8 + 2];
joined_r0x00bdafb5:
                if ((int)(uint)bVar5 <= iVar4) goto LAB_00bdbe58;
                goto LAB_00bdcff8;
              }
              if (iVar4 < (int)(uint)i[lVar14 + lVar8]) {
                bVar5 = i[lVar8 + -3];
joined_r0x00bdc503:
                if (iVar4 < (int)(uint)bVar5) {
                  bVar5 = i[lVar3 + lVar8];
                  lVar17 = lVar21;
                  goto joined_r0x00bdbb47;
                }
              }
            }
            else if ((iVar4 < (int)(uint)i[lVar14 + lVar8]) && (iVar4 < (int)(uint)i[lVar8 + -3])) {
              bVar5 = i[lVar3 + lVar8];
              goto joined_r0x00bdc992;
            }
          }
        }
        else if ((((int)(uint)i[lVar24 + lVar8] < iVar11) && ((int)(uint)i[lVar25 + lVar8] < iVar11)
                 ) && ((int)(uint)i[lVar13 + lVar8] < iVar11)) {
          if ((int)(uint)i[lVar14 + lVar8] < iVar11) {
            if ((int)(uint)i[lVar8 + -3] < iVar11) {
              if (iVar11 <= (int)(uint)i[lVar3 + lVar8]) {
                if (iVar11 <= (int)(uint)i[lVar8 + 3]) goto LAB_00bdcff3;
                bVar5 = i[lVar15 + lVar8];
                goto joined_r0x00bdc13a;
              }
              if (iVar11 <= (int)(uint)i[lVar21 + lVar8]) {
                bVar5 = i[lVar15 + lVar8];
                goto joined_r0x00bdc13a;
              }
              if ((int)(uint)i[lVar22 + lVar8] < iVar11) goto LAB_00bdcff8;
            }
            else {
              if ((iVar11 <= (int)(uint)i[lVar20 + lVar8 + 3]) ||
                 (iVar11 <= (int)(uint)i[lVar8 + 3])) goto LAB_00bdcff3;
              bVar5 = i[lVar15 + lVar8];
joined_r0x00bdc13a:
              if (iVar11 <= (int)(uint)bVar5) goto LAB_00bdcff3;
            }
            bVar5 = i[lVar1 + lVar8];
joined_r0x00bdbc27:
            if ((int)(uint)bVar5 < iVar11) {
              uVar12 = (uint)i[lVar2 + lVar8];
              goto LAB_00bdc968;
            }
          }
          else if ((((int)(uint)i[lVar7 + lVar8 + 2] < iVar11) &&
                   ((int)(uint)i[lVar20 + lVar8 + 3] < iVar11)) &&
                  ((int)(uint)i[lVar8 + 3] < iVar11)) {
            bVar5 = i[lVar15 + lVar8];
            goto joined_r0x00bdc13a;
          }
        }
LAB_00bdcff3:
        iVar19 = iVar18;
        iVar18 = iVar28;
      }
LAB_00bdcff8:
      iVar28 = iVar18;
      if (iVar28 == iVar19 || iVar28 == iVar19 + -1) goto code_r0x00bdd031;
      iVar18 = (iVar28 + iVar19) / 2;
    } while( true );
  }
  return piVar9;
code_r0x00bdd031:
  piVar9[uVar23] = iVar28;
  uVar23 = uVar23 + 1;
  if (uVar23 == (uint)num_corners) {
    return piVar9;
  }
  goto LAB_00bda895;
}

Assistant:

int* aom_fast9_score(const byte* i, int stride, const xy* corners, int num_corners, int b)
{
  int* scores = (int*)malloc(sizeof(int)* num_corners);
  int n;

  int pixel[16];
  if(!scores) return NULL;
  make_offsets(pixel, stride);

  for(n=0; n < num_corners; n++)
    scores[n] = fast9_corner_score(i + corners[n].y*stride + corners[n].x, pixel, b);

  return scores;
}